

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.cc
# Opt level: O0

OutputFile * __thiscall re2c::OutputFile::wu64(OutputFile *this,uint64_t n)

{
  ostream *this_00;
  uint64_t n_local;
  OutputFile *this_local;
  
  this_00 = stream(this);
  std::ostream::operator<<(this_00,n);
  return this;
}

Assistant:

OutputFile & OutputFile::wu64 (uint64_t n)
{
	stream () << n;
	return *this;
}